

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseCatchInstrList(WastParser *this,CatchVector *catches)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  bool bVar4;
  bool bVar5;
  allocator<char> local_101;
  CatchVector *local_100;
  Token token;
  Catch catch_;
  
  bVar4 = false;
  bVar5 = false;
  local_100 = catches;
  do {
    TVar2 = Peek(this,0);
    if (1 < TVar2 - Catch) {
      if (bVar5) {
        return (Result)Ok;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&catch_,"catch",&local_101);
      token.loc.filename._M_len = 0;
      token.loc.filename._M_str = (char *)0x0;
      token.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&token,&catch_
                 ,&catch_.var);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&token,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&token);
      std::__cxx11::string::_M_dispose();
      return (Result)RVar3.enum_;
    }
    GetLocation(&token.loc,this);
    Catch::Catch(&catch_,&token.loc);
    Consume(&token,this);
    if (token.token_type_ == Catch) {
      RVar3 = ParseVar(this,&catch_.var);
      if (RVar3.enum_ != Error) {
LAB_00185413:
        RVar3 = ParseInstrList(this,&catch_.exprs);
        if (RVar3.enum_ != Error) {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    (local_100,&catch_);
          bVar1 = true;
          bVar5 = true;
          goto LAB_00185440;
        }
      }
      bVar1 = false;
    }
    else {
      bVar1 = !bVar4;
      bVar4 = true;
      if (bVar1) goto LAB_00185413;
      bVar1 = false;
      Error(this,0x1dfd69);
      bVar4 = true;
    }
LAB_00185440:
    Catch::~Catch(&catch_);
    if (!bVar1) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchInstrList(CatchVector* catches) {
  WABT_TRACE(ParseCatchInstrList);
  bool parsedCatch = false;
  bool parsedCatchAll = false;

  while (IsCatch(Peek())) {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseInstrList(&catch_.exprs));
    catches->push_back(std::move(catch_));
    parsedCatch = true;
  }

  if (!parsedCatch) {
    return ErrorExpected({"catch"});
  }

  return Result::Ok;
}